

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * cppcms::b64url::encode(string *__return_storage_ptr__,string *input)

{
  size_t s;
  uchar *begin;
  int iVar1;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_3a;
  value_type_conflict local_39;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  s = input->_M_string_length;
  iVar1 = encoded_size(s);
  if (iVar1 != 0) {
    begin = (uchar *)(input->_M_dataplus)._M_p;
    local_39 = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_38,(long)iVar1,&local_39,&local_3a);
    encode(begin,begin + s,(uchar *)local_38._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::assign
              ((char *)__return_storage_ptr__,
               (ulong)local_38._M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CPPCMS_API encode(std::string const &input)
{
	std::string result;
	size_t enc_size = encoded_size(input.size());
	if(enc_size == 0)
		return result;
	unsigned char const *begin = reinterpret_cast<unsigned char const *>(input.c_str());
	unsigned char const *end = begin + input.size();
	std::vector<char> buf(enc_size,0);
	unsigned char *outbuf =  reinterpret_cast<unsigned char *>(&buf[0]);
	encode(begin,end,outbuf);
	result.assign(&buf[0],enc_size);
	return result;
}